

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

float Abc_SclCountNonBufferDelayInt(SC_Man *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int i;
  float Delay;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  local_2c = 0.0;
  iVar1 = Abc_ObjIsBuffer(pObj);
  if (iVar1 == 0) {
    p_local._4_4_ = Abc_SclObjTimeMax(p,pObj);
  }
  else {
    for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_30 < iVar1; local_30 = local_30 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_30);
      fVar2 = Abc_SclCountNonBufferDelayInt(p,pObj_00);
      local_2c = fVar2 + local_2c;
    }
    p_local._4_4_ = local_2c;
  }
  return p_local._4_4_;
}

Assistant:

float Abc_SclCountNonBufferDelayInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Delay = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return Abc_SclObjTimeMax(p, pObj);
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Delay += Abc_SclCountNonBufferDelayInt( p, pFanout );
    return Delay;
}